

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O2

void google::protobuf::CaptureTestStdout(void)

{
  int __fd;
  Nullable<const_char_*> failure_msg;
  LogMessage *this;
  int *piVar1;
  char *pcVar2;
  LogMessage local_b0 [3];
  tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_80;
  LogMessage local_78;
  string local_60;
  AlphaNum local_40;
  
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (original_stdout_,-1,"original_stdout_ == -1");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    TestTempDir_abi_cxx11_();
    local_b0[0].errno_saver_.saved_errno_ = local_78.errno_saver_.saved_errno_;
    local_b0[0]._4_4_ = local_78._4_4_;
    local_b0[0].data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )local_80.
                       super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                       ._M_head_impl;
    local_40.piece_ = absl::lts_20250127::NullSafeStringView("/captured_stdout");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_60,(lts_20250127 *)local_b0,&local_40,&local_40);
    std::__cxx11::string::operator=
              ((string *)&stdout_capture_filename__abi_cxx11_,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    __fd = open(stdout_capture_filename__abi_cxx11_,0xc1,0x1ff);
    if (-1 < __fd) {
      original_stdout_ = dup(1);
      close(1);
      dup2(__fd,1);
      close(__fd);
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
               ,0xa4,"fd >= 0");
    this = absl::lts_20250127::log_internal::LogMessage::operator<<(local_b0,(char (*) [7])"open: ")
    ;
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    local_40.piece_._M_len = (size_t)pcVar2;
    absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(this,(char **)&local_40);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
               ,0x9e,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (local_b0,(char (*) [19])"Already capturing.");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_b0);
}

Assistant:

void CaptureTestStdout() {
  ABSL_CHECK_EQ(original_stdout_, -1) << "Already capturing.";

  stdout_capture_filename_ = absl::StrCat(TestTempDir(), "/captured_stdout");

  int fd = open(stdout_capture_filename_.c_str(),
                O_WRONLY | O_CREAT | O_EXCL | O_BINARY, 0777);
  ABSL_CHECK(fd >= 0) << "open: " << strerror(errno);

  original_stdout_ = dup(1);
  close(1);
  dup2(fd, 1);
  close(fd);
}